

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O3

void __thiscall
amrex::MLMG::compResidual
          (MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_res,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_rhs)

{
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *this_00;
  Vector<int,_std::allocator<int>_> *this_01;
  MLLinOp *pMVar1;
  pointer pAVar2;
  __uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_> _Var3;
  undefined8 uVar4;
  _func_int **pp_Var5;
  pointer ppMVar6;
  bool bVar7;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> _Var8;
  MLMG *pMVar9;
  int iVar10;
  MultiFab *pMVar11;
  MultiFab *pMVar12;
  MultiFab *pMVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> local_90;
  MLMG *local_88;
  int local_7c;
  MultiFab *local_78;
  IntVect ng_sol;
  long *local_50;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_48;
  MLLinOp *local_40;
  MultiFab *local_38;
  
  local_48 = a_rhs;
  local_7c = (*this->linop->_vptr_MLLinOp[5])();
  ng_sol.vect[0] = 1;
  ng_sol.vect[1] = 1;
  ng_sol.vect[2] = 1;
  uVar14 = (ulong)(uint)(this->linop->info).hidden_direction;
  if (uVar14 < 3) {
    ng_sol.vect[uVar14] = 0;
  }
  this_00 = &this->sol;
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (&this_00->super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)this->namrlevs);
  this_01 = &this->sol_is_alias;
  local_90._M_head_impl._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this_01->super_vector<int,_std::allocator<int>_>,(long)this->namrlevs,
             (value_type_conflict *)&local_90);
  local_88 = this;
  if (0 < this->namrlevs) {
    uVar14 = 0;
    do {
      pMVar11 = (a_sol->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14];
      if ((this->cf_strategy == ghostnodes) ||
         (((uVar4 = *(undefined8 *)
                     (pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect,
           ng_sol.vect[0] == (int)uVar4 && (ng_sol.vect[1] == (int)((ulong)uVar4 >> 0x20))) &&
          ((pMVar11->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2] ==
           ng_sol.vect[2])))) {
        pMVar1 = this->linop;
        local_50 = (long *)operator_new(0x10);
        *local_50 = (long)&PTR_Type_007153f0;
        local_50[1] = (long)pMVar11;
        (*pMVar1->_vptr_MLLinOp[0x2a])(&local_90,pMVar1,&local_50);
        _Var8._M_head_impl = local_90._M_head_impl;
        pAVar2 = (this_00->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_90._M_head_impl = (innards_base *)0x0;
        _Var3._M_t.
        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
             *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *)
              &pAVar2[uVar14].m_ptr._M_t;
        pAVar2[uVar14].m_ptr._M_t =
             (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
              )_Var8._M_head_impl;
        if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )_Var3._M_t.
              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )0x0) {
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                _M_head_impl + 0x10))();
        }
        this = local_88;
        if (local_90._M_head_impl != (innards_base *)0x0) {
          (*(local_90._M_head_impl)->_vptr_innards_base[2])();
        }
        local_90._M_head_impl = (innards_base *)0x0;
        if (local_50 != (long *)0x0) {
          (**(code **)(*local_50 + 0x10))();
        }
        (this_01->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar14] = 1;
      }
      else {
        if ((this_01->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar14] != 0) {
          (*this->linop->_vptr_MLLinOp[0x27])(&local_90,this->linop,uVar14 & 0xffffffff,0,&ng_sol);
          _Var8._M_head_impl = local_90._M_head_impl;
          pAVar2 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_90._M_head_impl = (innards_base *)0x0;
          _Var3._M_t.
          super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
          .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
               *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *
                )&pAVar2[uVar14].m_ptr._M_t;
          pAVar2[uVar14].m_ptr._M_t =
               (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
                )_Var8._M_head_impl;
          if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
               )_Var3._M_t.
                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
               )0x0) {
            (**(code **)(*(long *)_Var3._M_t.
                                  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                  _M_head_impl + 0x10))();
          }
          if (local_90._M_head_impl != (innards_base *)0x0) {
            (*(local_90._M_head_impl)->_vptr_innards_base[2])();
          }
        }
        pMVar11 = Any::get<amrex::MultiFab>
                            ((this_00->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar14);
        MultiFab::Copy(pMVar11,(a_sol->
                               super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar14],0,0,local_7c,0);
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)this->namrlevs);
  }
  pp_Var5 = this->linop->_vptr_MLLinOp;
  if (this->linop_prepared == false) {
    (*pp_Var5[0x1d])();
    this->linop_prepared = true;
  }
  else {
    iVar10 = (*pp_Var5[7])();
    if ((char)iVar10 != '\0') {
      (*this->linop->_vptr_MLLinOp[8])();
    }
  }
  lVar16 = (long)this->finest_amr_lev;
  if (-1 < lVar16) {
    local_40 = this->linop;
    lVar17 = lVar16 << 3;
    lVar16 = lVar16 + 1;
    do {
      if (lVar16 == 1) {
        local_78 = (MultiFab *)0x0;
      }
      else {
        local_78 = Any::get<amrex::MultiFab>
                             ((Any *)((long)&(this_00->
                                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                             ._M_impl.super__Vector_impl_data._M_start[-1].m_ptr.
                                             _M_t.
                                             super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                             .
                                             super__Head_base<0UL,_amrex::Any::innards_base_*,_false>
                                             ._M_head_impl + lVar17));
      }
      uVar14 = lVar16 - 1;
      pMVar11 = (local_48->
                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar16 + -1];
      pMVar1 = local_88->linop;
      pMVar13 = (a_res->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar16 + -1];
      pMVar12 = Any::get<amrex::MultiFab>
                          ((Any *)((long)&(((local_88->sol).
                                            super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr)._M_t.
                                          super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                          .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                          _M_head_impl + lVar17));
      pMVar9 = local_88;
      local_38 = pMVar11;
      (*pMVar1->_vptr_MLLinOp[0x10])(pMVar1,uVar14 & 0xffffffff,pMVar13,pMVar12,pMVar11,local_78);
      if ((long)uVar14 < (long)pMVar9->finest_amr_lev) {
        pMVar1 = pMVar9->linop;
        local_78 = (a_res->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar16 + -1];
        pMVar13 = Any::get<amrex::MultiFab>
                            ((Any *)((long)&(((local_88->sol).
                                              super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                              super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr).
                                            _M_t.
                                            super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                            .
                                            super__Head_base<0UL,_amrex::Any::innards_base_*,_false>
                                            ._M_head_impl + lVar17));
        pMVar11 = (a_res->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar16];
        pMVar12 = Any::get<amrex::MultiFab>
                            ((Any *)((long)&(local_88->sol).
                                            super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                            ._M_impl.super__Vector_impl_data._M_start[1].m_ptr._M_t.
                                            super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                            .
                                            super__Head_base<0UL,_amrex::Any::innards_base_*,_false>
                                            ._M_head_impl + lVar17));
        (*pMVar1->_vptr_MLLinOp[0x12])
                  (pMVar1,uVar14 & 0xffffffff,local_78,pMVar13,local_38,pMVar11,pMVar12,
                   (local_48->
                   super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                   super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar16]);
        pMVar1 = local_88->linop;
        if (((pMVar1->m_ixtype).vect[1] == 0 && (pMVar1->m_ixtype).vect[0] == 0) &&
           ((pMVar1->m_ixtype).vect[2] == 0)) {
          ppMVar6 = (a_res->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          EB_average_down(ppMVar6[lVar16],ppMVar6[lVar16 + -1],0,local_7c,
                          (local_40->m_amr_ref_ratio).super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar16 + -1]);
        }
      }
      lVar17 = lVar17 + -8;
      lVar15 = lVar16 + -1;
      bVar7 = 0 < lVar16;
      lVar16 = lVar15;
    } while (lVar15 != 0 && bVar7);
  }
  return;
}

Assistant:

void
MLMG::compResidual (const Vector<MultiFab*>& a_res, const Vector<MultiFab*>& a_sol,
                    const Vector<MultiFab const*>& a_rhs)
{
    BL_PROFILE("MLMG::compResidual()");

    const int ncomp = linop.getNComp();
    IntVect ng_sol(1);
    if (linop.hasHiddenDimension()) ng_sol[linop.hiddenDirection()] = 0;

    sol.resize(namrlevs);
    sol_is_alias.resize(namrlevs,true);
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes || a_sol[alev]->nGrowVect() == ng_sol)
        {
            sol[alev] = linop.AnyMakeAlias(*a_sol[alev]);
            sol_is_alias[alev] = true;
        }
        else
        {
            if (sol_is_alias[alev])
            {
                sol[alev] = linop.AnyMake(alev, 0, ng_sol);
            }
            MultiFab::Copy(sol[alev].get<MultiFab>(), *a_sol[alev], 0, 0, ncomp, 0);
        }
    }

    if (!linop_prepared) {
        linop.prepareForSolve();
        linop_prepared = true;
    } else if (linop.needsUpdate()) {
        linop.update();
    }

    const auto& amrrr = linop.AMRRefRatio();

    for (int alev = finest_amr_lev; alev >= 0; --alev) {
        const MultiFab* crse_bcdata = (alev > 0) ? &(sol[alev-1].get<MultiFab>()) : nullptr;
        const MultiFab* prhs = a_rhs[alev];
#if (AMREX_SPACEDIM != 3)
        int nghost = (cf_strategy == CFStrategy::ghostnodes) ? linop.getNGrow(alev) : 0;
        Any rhstmp_a(MultiFab(prhs->boxArray(), prhs->DistributionMap(), ncomp, nghost,
                              MFInfo(), *linop.Factory(alev)));
        MultiFab& rhstmp = rhstmp_a.get<MultiFab>();
        MultiFab::Copy(rhstmp, *prhs, 0, 0, ncomp, nghost);
        linop.applyMetricTerm(alev, 0, rhstmp_a);
        linop.unimposeNeumannBC(alev, rhstmp_a);
        linop.applyInhomogNeumannTerm(alev, rhstmp_a);
        prhs = &rhstmp;
#endif
        linop.solutionResidual(alev, *a_res[alev], sol[alev].get<MultiFab>(), *prhs, crse_bcdata);
        if (alev < finest_amr_lev) {
            linop.reflux(alev, *a_res[alev], sol[alev].get<MultiFab>(), *prhs,
                         *a_res[alev+1], sol[alev+1].get<MultiFab>(), *a_rhs[alev+1]);
            if (linop.isCellCentered()) {
#ifdef AMREX_USE_EB
                amrex::EB_average_down(*a_res[alev+1], *a_res[alev], 0, ncomp, amrrr[alev]);
#else
                amrex::average_down(*a_res[alev+1], *a_res[alev], 0, ncomp, amrrr[alev]);
#endif
            }
        }
    }


#if (AMREX_SPACEDIM != 3)
    for (int alev = 0; alev <= finest_amr_lev; ++alev) {
        linop.unapplyMetricTerm(alev, 0, *a_res[alev]);
    }
#endif
}